

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamStandardIndex::SummarizeIndexFile(BamStandardIndex *this)

{
  pointer pBVar1;
  pointer refSummary;
  int numReferences;
  int local_1c;
  
  ReadNumReferences(this,&local_1c);
  ReserveForSummary(this,&local_1c);
  pBVar1 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (refSummary = (this->m_indexFileSummary).
                    super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                    ._M_impl.super__Vector_impl_data._M_start; refSummary != pBVar1;
      refSummary = refSummary + 1) {
    SummarizeReference(this,refSummary);
  }
  return;
}

Assistant:

void BamStandardIndex::SummarizeIndexFile(void) {

    // load number of reference sequences
    int numReferences;
    ReadNumReferences(numReferences);

    // initialize file summary data
    ReserveForSummary(numReferences);

    // iterate over reference entries
    BaiFileSummary::iterator summaryIter = m_indexFileSummary.begin();
    BaiFileSummary::iterator summaryEnd  = m_indexFileSummary.end();
    for ( int i = 0; summaryIter != summaryEnd; ++summaryIter, ++i )
        SummarizeReference(*summaryIter);
}